

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

XrEnvironmentBlendMode __thiscall
anon_unknown.dwarf_53f39::OpenXrProgram::GetPreferredBlendMode(OpenXrProgram *this)

{
  XrViewConfigurationType XVar1;
  XrEnvironmentBlendMode XVar2;
  XrInstance pXVar3;
  XrSystemId XVar4;
  bool bVar5;
  XrResult XVar6;
  element_type *peVar7;
  ulong __n;
  XrEnvironmentBlendMode *pXVar8;
  size_type sVar9;
  allocator local_b1;
  string local_b0 [32];
  XrEnvironmentBlendMode *local_90;
  XrEnvironmentBlendMode *blendMode;
  iterator __end2;
  iterator __begin2;
  vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *__range2;
  undefined1 local_68 [8];
  vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> blendModes;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  OpenXrProgram *pOStack_10;
  uint32_t count;
  OpenXrProgram *this_local;
  
  pXVar3 = this->m_instance;
  XVar4 = this->m_systemId;
  pOStack_10 = this;
  peVar7 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_options);
  XVar6 = xrEnumerateEnvironmentBlendModes
                    (pXVar3,XVar4,(peVar7->Parsed).ViewConfigType,0,&local_14,0);
  CheckXrResult(XVar6,
                "xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &count, nullptr)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:283"
               );
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Check failed",&local_39);
    Throw((string *)local_38,"count > 0",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:284"
         );
  }
  __n = (ulong)local_14;
  std::allocator<XrEnvironmentBlendMode>::allocator
            ((allocator<XrEnvironmentBlendMode> *)((long)&__range2 + 7));
  std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::vector
            ((vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *)local_68,__n
             ,(allocator<XrEnvironmentBlendMode> *)((long)&__range2 + 7));
  std::allocator<XrEnvironmentBlendMode>::~allocator
            ((allocator<XrEnvironmentBlendMode> *)((long)&__range2 + 7));
  pXVar3 = this->m_instance;
  XVar4 = this->m_systemId;
  peVar7 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_options);
  XVar1 = (peVar7->Parsed).ViewConfigType;
  pXVar8 = std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::data
                     ((vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *)
                      local_68);
  XVar6 = xrEnumerateEnvironmentBlendModes(pXVar3,XVar4,XVar1,local_14,&local_14,pXVar8);
  CheckXrResult(XVar6,
                "xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, count, &count, blendModes.data())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:288"
               );
  __end2 = std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::begin
                     ((vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *)
                      local_68);
  blendMode = (XrEnvironmentBlendMode *)
              std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::end
                        ((vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *)
                         local_68);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<XrEnvironmentBlendMode_*,_std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>_>
                                *)&blendMode);
    if (!bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,
                 "No acceptable blend mode returned from the xrEnumerateEnvironmentBlendModes",
                 &local_b1);
      Throw((string *)local_b0,(char *)0x0,
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:292"
           );
    }
    local_90 = __gnu_cxx::
               __normal_iterator<XrEnvironmentBlendMode_*,_std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>_>
               ::operator*(&__end2);
    sVar9 = std::
            set<XrEnvironmentBlendMode,_std::less<XrEnvironmentBlendMode>,_std::allocator<XrEnvironmentBlendMode>_>
            ::count(&this->m_acceptableBlendModes,local_90);
    if (sVar9 != 0) break;
    __gnu_cxx::
    __normal_iterator<XrEnvironmentBlendMode_*,_std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>_>
    ::operator++(&__end2);
  }
  XVar2 = *local_90;
  std::vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_>::~vector
            ((vector<XrEnvironmentBlendMode,_std::allocator<XrEnvironmentBlendMode>_> *)local_68);
  return XVar2;
}

Assistant:

XrEnvironmentBlendMode GetPreferredBlendMode() const override {
        uint32_t count;
        CHECK_XRCMD(xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &count, nullptr));
        CHECK(count > 0);

        std::vector<XrEnvironmentBlendMode> blendModes(count);
        CHECK_XRCMD(xrEnumerateEnvironmentBlendModes(m_instance, m_systemId, m_options->Parsed.ViewConfigType, count, &count,
                                                     blendModes.data()));
        for (const auto& blendMode : blendModes) {
            if (m_acceptableBlendModes.count(blendMode)) return blendMode;
        }
        THROW("No acceptable blend mode returned from the xrEnumerateEnvironmentBlendModes");
    }